

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O3

void __thiscall QCryptographicHash::QCryptographicHash(QCryptographicHash *this,Algorithm method)

{
  State *this_00;
  
  this_00 = (State *)operator_new(0x1f0);
  QCryptographicHashPrivate::State::reset(this_00,method);
  *(undefined8 *)(this_00 + 0x1a0) = 0;
  this_00[0x1e8] = (State)0x0;
  *(Algorithm *)(this_00 + 0x1ec) = method;
  *(State **)this = this_00;
  return;
}

Assistant:

QCryptographicHash::QCryptographicHash(Algorithm method)
    : d(new QCryptographicHashPrivate{method})
{
}